

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void convergeephemerons(global_State *g)

{
  Table *pTVar1;
  int iVar2;
  bool bVar3;
  Table *h;
  
  do {
    h = (Table *)g->ephemeron;
    g->ephemeron = (GCObject *)0x0;
    bVar3 = true;
    while (h != (Table *)0x0) {
      pTVar1 = (Table *)h->gclist;
      iVar2 = traverseephemeron(g,h);
      h = pTVar1;
      if (iVar2 != 0) {
        propagateall(g);
        bVar3 = false;
      }
    }
  } while (!bVar3);
  return;
}

Assistant:

static void convergeephemerons(global_State *g) {
    int changed;
    do {
        GCObject *w;
        GCObject *next = g->ephemeron;  /* get ephemeron list */
        g->ephemeron = NULL;  /* tables may return to this list when traversed */
        changed = 0;
        while ((w = next) != NULL) {
            next = gco2t(w)->gclist;
            if (traverseephemeron(g, gco2t(w))) {  /* traverse marked some value? */
                propagateall(g);  /* propagate changes */
                changed = 1;  /* will have to revisit all ephemeron tables */
            }
        }
    } while (changed);
}